

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3_column_decltype16(sqlite3_stmt *pStmt,int N)

{
  void *pvVar1;
  
  pvVar1 = columnName(pStmt,N,sqlite3_value_text16,1);
  return pvVar1;
}

Assistant:

SQLITE_API const void *sqlite3_column_decltype16(sqlite3_stmt *pStmt, int N){
  return columnName(
      pStmt, N, (const void*(*)(Mem*))sqlite3_value_text16, COLNAME_DECLTYPE);
}